

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::mul(Matrix *this,double coef)

{
  bool bVar1;
  reference this_00;
  reference pdVar2;
  double *val;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  vector<double,_std::allocator<double>_> *vec;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  double coef_local;
  Matrix *this_local;
  
  __end1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(&this->m_vals);
  vec = (vector<double,_std::allocator<double>_> *)
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::end(&this->m_vals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                *)&vec);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::vector<double,_std::allocator<double>_>::begin(this_00);
    val = (double *)std::vector<double,_std::allocator<double>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)&val);
      if (!bVar1) break;
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end2);
      *pdVar2 = coef * *pdVar2;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1);
  }
  return this;
}

Assistant:

Matrix& Matrix::mul(double coef){
    for(auto& vec: m_vals){
        for(auto& val: vec){
            val*=coef;
        }
    }

    return *this;
}